

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::insert_node<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
          (hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
           *this,transaction_base *transaction,index_pointer node,
          pair<pstore::uint128,_pstore::extent<unsigned_char>_> *value,hash_type hash,uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  bool bVar1;
  database *this_00;
  array_stack<pstore::index::details::parent_type,_13UL> *this_01;
  uint64_t uVar2;
  pair<pstore::index::details::index_pointer,_bool> pVar3;
  index_pointer local_140 [2];
  index_pointer local_130;
  undefined1 local_128;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_120;
  array_stack<pstore::index::details::parent_type,_13UL> *local_118;
  index_pointer local_110;
  undefined1 local_108;
  index_pointer local_100 [2];
  index_pointer local_f0;
  undefined1 local_e8;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_e0;
  array_stack<pstore::index::details::parent_type,_13UL> *local_d8;
  index_pointer local_d0;
  undefined1 local_c8;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_c0;
  index_pointer local_b8;
  ulong local_b0;
  hash_type existing_hash;
  parent_type local_a0;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_90;
  address local_88;
  value_type local_80;
  key_type *local_78;
  key_type existing_key;
  bool local_59;
  index_pointer iStack_58;
  bool key_exists;
  index_pointer result;
  bool is_upsert_local;
  hash_type hStack_48;
  uint shifts_local;
  hash_type hash_local;
  pair<pstore::uint128,_pstore::extent<unsigned_char>_> *value_local;
  transaction_base *transaction_local;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *this_local;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents_local;
  index_pointer node_local;
  
  this_local = (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                *)parents.ptr_;
  result.addr_.a_._3_1_ = is_upsert;
  result.addr_.a_._4_4_ = shifts;
  hStack_48 = hash;
  hash_local = (hash_type)value;
  value_local = (pair<pstore::uint128,_pstore::extent<unsigned_char>_> *)transaction;
  transaction_local = (transaction_base *)this;
  parents_local.ptr_ = (array_stack<pstore::index::details::parent_type,_13UL> *)node;
  details::index_pointer::index_pointer((index_pointer *)&stack0xffffffffffffffa8);
  local_59 = false;
  bVar1 = details::index_pointer::is_leaf((index_pointer *)&parents_local);
  if (bVar1) {
    this_00 = transaction_base::db((transaction_base *)value_local);
    local_80 = (value_type)details::index_pointer::to_address((index_pointer *)&parents_local);
    local_78 = hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
               ::get_key((key_type *)this,
                         (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                          *)this_00,(database *)local_80,(address)value);
    bVar1 = std::equal_to<pstore::uint128>::operator()
                      ((equal_to<pstore::uint128> *)(this + 0x29),(uint128 *)hash_local,
                       (uint128 *)&local_78);
    if (bVar1) {
      if ((result.addr_.a_._3_1_ & 1) == 0) {
        this_01 = gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
                  operator->((not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                              *)&this_local);
        existing_hash = (hash_type)parents_local.ptr_;
        details::parent_type::parent_type
                  (&local_a0,(index_pointer)parents_local.ptr_,0xffffffffffffffff);
        array_stack<pstore::index::details::parent_type,_13UL>::push(this_01,&local_a0);
        iStack_58.addr_.a_ = (address)(address)parents_local.ptr_;
      }
      else {
        local_90 = this_local;
        local_88 = store_leaf_node<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
                             (this,(transaction_base *)value_local,
                              (pair<pstore::uint128,_pstore::extent<unsigned_char>_> *)hash_local,
                              (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                               )this_local);
        details::index_pointer::operator=((index_pointer *)&stack0xffffffffffffffa8,&local_88);
      }
      local_59 = true;
    }
    else {
      uVar2 = u128_hash::operator()((u128_hash *)(this + 0x28),(digest *)&local_78);
      local_b0 = uVar2 >> ((byte)result.addr_.a_._4_4_ & 0x3f);
      local_c0 = this_local;
      local_b8 = insert_into_leaf<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
                           (this,(transaction_base *)value_local,(index_pointer *)&parents_local,
                            (pair<pstore::uint128,_pstore::extent<unsigned_char>_> *)hash_local,
                            local_b0,hStack_48,result.addr_.a_._4_4_,
                            (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                             )this_local);
      iStack_58 = local_b8;
    }
  }
  else {
    bVar1 = details::depth_is_internal_node(result.addr_.a_._4_4_);
    if (bVar1) {
      local_d8 = parents_local.ptr_;
      local_e0 = this_local;
      pVar3 = insert_into_internal<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
                        (this,(transaction_base *)value_local,(index_pointer)parents_local.ptr_,
                         (pair<pstore::uint128,_pstore::extent<unsigned_char>_> *)hash_local,
                         hStack_48,result.addr_.a_._4_4_,
                         (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                         )this_local,(bool)(result.addr_.a_._3_1_ & 1));
      local_f0 = pVar3.first;
      local_e8 = pVar3.second;
      local_d0 = local_f0;
      local_c8 = local_e8;
      std::tie<pstore::index::details::index_pointer,bool>
                (local_100,(bool *)&stack0xffffffffffffffa8);
      std::tuple<pstore::index::details::index_pointer&,bool&>::operator=
                ((tuple<pstore::index::details::index_pointer&,bool&> *)&local_100[0].addr_,
                 (pair<pstore::index::details::index_pointer,_bool> *)&local_d0.addr_);
    }
    else {
      local_118 = parents_local.ptr_;
      local_120 = this_local;
      pVar3 = insert_into_linear<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
                        (this,(transaction_base *)value_local,(index_pointer)parents_local.ptr_,
                         (pair<pstore::uint128,_pstore::extent<unsigned_char>_> *)hash_local,
                         (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                         )this_local,(bool)(result.addr_.a_._3_1_ & 1));
      local_130 = pVar3.first;
      local_128 = pVar3.second;
      local_110 = local_130;
      local_108 = local_128;
      std::tie<pstore::index::details::index_pointer,bool>
                (local_140,(bool *)&stack0xffffffffffffffa8);
      std::tuple<pstore::index::details::index_pointer&,bool&>::operator=
                ((tuple<pstore::index::details::index_pointer&,bool&> *)&local_140[0].addr_,
                 (pair<pstore::index::details::index_pointer,_bool> *)&local_110.addr_);
    }
  }
  pVar3 = std::make_pair<pstore::index::details::index_pointer&,bool&>
                    (&stack0xffffffffffffffa8,&local_59);
  return pVar3;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_node (
            transaction_base & transaction, index_pointer const node, OtherValueType const & value,
            hash_type hash, unsigned shifts, gsl::not_null<parent_stack *> parents, bool is_upsert)
            -> std::pair<index_pointer, bool> {

            index_pointer result;
            bool key_exists = false;
            if (node.is_leaf ()) { // This node is a leaf node.
                key_type const existing_key =
                    get_key (transaction.db (), node.to_address ()); // Read key.
                if (equal_ (value.first, existing_key)) {
                    if (is_upsert) {
                        result = this->store_leaf_node (transaction, value, parents);
                    } else {
                        parents->push (details::parent_type{node});
                        result = node;
                    }
                    key_exists = true;
                } else {
                    auto const existing_hash =
                        static_cast<hash_type> ((hash_ (existing_key) >> shifts));
                    result = this->insert_into_leaf (transaction, node, value, existing_hash, hash,
                                                     shifts, parents);
                }
            } else {
                // This node is an internal or a linear node.
                if (details::depth_is_internal_node (shifts)) {
                    std::tie (result, key_exists) = this->insert_into_internal (
                        transaction, node, value, hash, shifts, parents, is_upsert);
                } else {
                    std::tie (result, key_exists) =
                        this->insert_into_linear (transaction, node, value, parents, is_upsert);
                }
            }

            return std::make_pair (result, key_exists);
        }